

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O2

void avx::RgbToBgr(uint8_t *outY,uint8_t *inY,uint8_t *outYEnd,uint32_t rowSizeOut,
                  uint32_t rowSizeIn,uint8_t colorCount,uint32_t simdWidth,uint32_t totalSimdWidth,
                  uint32_t nonSimdWidth)

{
  uint8_t uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  uint8_t *puVar4;
  undefined7 in_register_00000089;
  ulong uVar5;
  ulong uVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  
  auVar3 = _DAT_0017f1e0;
  puVar7 = inY + 2;
  uVar5 = CONCAT71(in_register_00000089,colorCount) & 0xffffffff;
  puVar4 = outY + (ulong)totalSimdWidth + 2;
  for (; outY != outYEnd; outY = outY + rowSizeOut) {
    puVar8 = puVar7;
    for (uVar6 = 0; totalSimdWidth != uVar6; uVar6 = uVar6 + simdWidth) {
      puVar8 = puVar8 + simdWidth;
      auVar2 = vpshufb_avx2(*(undefined1 (*) [32])(inY + uVar6),auVar3);
      *(undefined1 (*) [32])(outY + uVar6) = auVar2;
      outY[uVar6 + 0xf] = inY[uVar6 + 0x11];
      outY[uVar6 + 0x11] = inY[uVar6 + 0xf];
    }
    if (nonSimdWidth != 0) {
      for (uVar6 = 0; nonSimdWidth != uVar6; uVar6 = uVar6 + uVar5) {
        puVar4[uVar6] = puVar8[-2];
        puVar4[uVar6 - 1] = puVar8[-1];
        uVar1 = *puVar8;
        puVar8 = puVar8 + uVar5;
        puVar4[uVar6 - 2] = uVar1;
      }
    }
    inY = inY + rowSizeIn;
    puVar4 = puVar4 + rowSizeOut;
    puVar7 = puVar7 + rowSizeIn;
  }
  return;
}

Assistant:

void RgbToBgr( uint8_t * outY, const uint8_t * inY, const uint8_t * outYEnd, uint32_t rowSizeOut, uint32_t rowSizeIn, 
                   const uint8_t colorCount, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        const simd ctrl = _mm256_setr_epi8(2, 1, 0, 5, 4, 3, 8, 7, 6, 11, 10, 9, 14, 13, 12, 15, 
                                           16, 17, 20, 19, 18, 23, 22, 21, 26, 25, 24, 29, 28, 27, 30, 31);
        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const uint8_t * inX  = inY;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + totalSimdWidth;

            for( ; outX != outXEnd; outX += simdWidth, inX += simdWidth ) {
                const simd * src = reinterpret_cast<const simd*> (inX);
                simd * dst = reinterpret_cast<simd*> (outX);
                simd result = _mm256_loadu_si256( src );
                result = _mm256_shuffle_epi8( result, ctrl );
                _mm256_storeu_si256( dst, result );
                *(outX + 15) = *(inX + 17);
                *(outX + 17) = *(inX + 15);
            }

            if( nonSimdWidth > 0 ) {
                const uint8_t * outXEndNonSimd = outXEnd + nonSimdWidth;
                for( ; outX != outXEndNonSimd; outX += colorCount, inX += colorCount ) {
                    *(outX + 2) = *(inX);
                    *(outX + 1) = *(inX + 1);
                    *(outX) = *(inX + 2);
                }
            }
        }
    }